

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O0

void http1_websocket_client_on_failed(http_s *h)

{
  void *pvVar1;
  http_settings_s *phVar2;
  websocket_settings_s *s;
  http_s *h_local;
  
  pvVar1 = h->udata;
  if (*(long *)((long)pvVar1 + 0x20) != 0) {
    (**(code **)((long)pvVar1 + 0x20))(0,*(undefined8 *)((long)pvVar1 + 0x28));
  }
  fio_free(h->udata);
  phVar2 = http_settings(h);
  phVar2->udata = (void *)0x0;
  h->udata = (void *)0x0;
  return;
}

Assistant:

static void http1_websocket_client_on_failed(http_s *h) {
  websocket_settings_s *s = h->udata;
  if (s->on_close)
    s->on_close(0, s->udata);
  fio_free(h->udata);
  h->udata = http_settings(h)->udata = NULL;
}